

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned_long>
          (detail *this,appender out,write_int_arg<unsigned_long> arg,
          basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  int iVar2;
  size_t sVar3;
  char *digits;
  long lVar4;
  appender aVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  basic_format_specs<char> *specs_00;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  int size;
  long lVar16;
  ulong uVar17;
  appender it;
  bool bVar18;
  format_decimal_result<char_*> fVar19;
  char buffer [20];
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_80;
  anon_class_40_3_03e05ccd_conflict local_78;
  
  specs_00 = arg._8_8_;
  pVar1 = specs_00->type;
  uVar15 = (uint)arg.abs_value;
  local_80.container = (buffer<char> *)this;
  local_78.write_digits.abs_value =
       (unsigned_long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  switch(pVar1) {
  case none:
  case dec:
    break;
  case oct:
    uVar17 = 0;
    local_78.write_digits.num_digits = 0;
    bVar11 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    do {
      local_78.write_digits.num_digits = local_78.write_digits.num_digits + 1;
      uVar17 = uVar17 - 1;
      bVar18 = (buffer<char> *)0x7 < bVar11.container;
      bVar11.container = bVar11.container >> 3;
    } while (bVar18);
    if (((char)*(ushort *)&specs_00->field_0x9 < '\0') &&
       (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container !=
        (buffer<char> *)0x0 && specs_00->precision <= local_78.write_digits.num_digits)) {
      uVar14 = 0x3000;
      if (uVar15 == 0) {
        uVar14 = 0x30;
      }
      uVar15 = (uVar14 | uVar15) + 0x1000000;
    }
    uVar14 = specs_00->width;
    iVar2 = specs_00->precision;
    if (iVar2 == -1 && uVar14 == 0) {
      if ((uVar15 != 0) && (uVar14 = uVar15 & 0xffffff, (uVar15 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
            (*(code *)**(undefined8 **)this)(this);
          }
          lVar16 = *(long *)(this + 0x10);
          *(long *)(this + 0x10) = lVar16 + 1;
          *(char *)(*(long *)(this + 8) + lVar16) = (char)uVar14;
          bVar18 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar18);
      }
      lVar16 = *(long *)(this + 0x10);
      uVar8 = lVar16 - uVar17;
      if (*(ulong *)(this + 0x18) < uVar8) {
        lVar16 = 0;
      }
      else {
        *(ulong *)(this + 0x10) = uVar8;
        lVar16 = lVar16 + *(long *)(this + 8);
      }
      if (lVar16 != 0) {
        pbVar7 = (byte *)(~uVar17 + lVar16);
        do {
          *pbVar7 = SUB81(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,0
                         ) & 7 | 0x30;
          pbVar7 = pbVar7 + -1;
          bVar18 = (buffer<char> *)0x7 <
                   (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 3
               );
        } while (bVar18);
        return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)this;
      }
      pbVar7 = (byte *)((long)&local_78.prefix + ~uVar17);
      pcVar9 = (char *)((long)&local_78 - uVar17);
      do {
        *pbVar7 = SUB81(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,0)
                  & 7 | 0x30;
        pbVar7 = pbVar7 + -1;
        bVar18 = (buffer<char> *)0x7 <
                 (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 3);
      } while (bVar18);
      goto LAB_00125a47;
    }
    uVar10 = (uVar15 >> 0x18) + local_78.write_digits.num_digits;
    local_78.data.size = (size_t)uVar10;
    if ((*(ushort *)&specs_00->field_0x9 & 0xf) == 4) {
      if (uVar10 < uVar14) {
        local_78.data.padding = uVar14 - local_78.data.size;
        local_78.data.size = (ulong)uVar14;
        goto LAB_00125945;
      }
    }
    else {
      local_78.data.padding = (size_t)(uint)(iVar2 - local_78.write_digits.num_digits);
      if (iVar2 - local_78.write_digits.num_digits != 0 && local_78.write_digits.num_digits <= iVar2
         ) {
        local_78.data.size = (size_t)(iVar2 + (uVar15 >> 0x18));
        goto LAB_00125945;
      }
    }
    local_78.data.padding = 0;
LAB_00125945:
    local_78.prefix = uVar15;
    aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_&>
                      ((appender)this,specs_00,local_78.data.size,local_78.data.size,
                       (anon_class_40_3_03e05ccd *)&local_78);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  case hex_lower:
  case hex_upper:
    if ((char)*(ushort *)&specs_00->field_0x9 < '\0') {
      uVar10 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar14 = uVar10 << 8;
      if (uVar15 == 0) {
        uVar14 = uVar10;
      }
      uVar15 = (uVar14 | uVar15) + 0x2000000;
    }
    bVar11 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    lVar16 = 0;
    do {
      lVar4 = lVar16;
      lVar16 = lVar4 + 1;
      bVar18 = (buffer<char> *)0xf < bVar11.container;
      bVar11.container = bVar11.container >> 4;
    } while (bVar18);
    uVar14 = specs_00->width;
    iVar2 = specs_00->precision;
    if (iVar2 == -1 && uVar14 == 0) {
      if ((uVar15 != 0) && (uVar14 = uVar15 & 0xffffff, (uVar15 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
            (*(code *)**(undefined8 **)this)(this);
          }
          lVar6 = *(long *)(this + 0x10);
          *(long *)(this + 0x10) = lVar6 + 1;
          *(char *)(*(long *)(this + 8) + lVar6) = (char)uVar14;
          bVar18 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar18);
      }
      lVar6 = *(long *)(this + 0x10);
      uVar17 = lVar6 + lVar16;
      if (*(ulong *)(this + 0x18) < uVar17) {
        lVar6 = 0;
      }
      else {
        *(ulong *)(this + 0x10) = uVar17;
        lVar6 = lVar6 + *(long *)(this + 8);
      }
      if (lVar6 != 0) {
        pcVar9 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar9 = "0123456789ABCDEF";
        }
        pcVar12 = (char *)(lVar6 + lVar16);
        do {
          pcVar12 = pcVar12 + -1;
          *pcVar12 = pcVar9[SUB84(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container,0) & 0xf];
          bVar18 = (buffer<char> *)0xf <
                   (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 4
               );
        } while (bVar18);
        return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)this;
      }
      pcVar12 = (char *)((long)&local_78.prefix + lVar4);
      pcVar9 = (char *)((long)&local_78.prefix + lVar4 + 1);
      pcVar13 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar13 = "0123456789ABCDEF";
      }
      do {
        *pcVar12 = pcVar13[SUB84(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                 container,0) & 0xf];
        pcVar12 = pcVar12 + -1;
        bVar18 = (buffer<char> *)0xf <
                 (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 4);
      } while (bVar18);
      goto LAB_00125a47;
    }
    lVar4 = ((ulong)(pVar1 == hex_upper) << 0x20) + lVar16;
    uVar10 = uVar15 >> 0x18;
    local_78.data.size = (ulong)uVar10 + lVar16;
    if ((*(ushort *)&specs_00->field_0x9 & 0xf) == 4) {
      if ((uint)local_78.data.size < uVar14) {
        local_78.data.padding = ((ulong)uVar14 - (ulong)uVar10) - lVar16;
        local_78.data.size = (ulong)uVar14;
        goto LAB_0012577d;
      }
    }
    else if ((int)lVar16 < iVar2) {
      local_78.data.size = (size_t)(uVar10 + iVar2);
      local_78.data.padding = (size_t)(uint)(iVar2 - (int)lVar16);
      goto LAB_0012577d;
    }
    local_78.data.padding = 0;
LAB_0012577d:
    local_78.write_digits.num_digits = (int)lVar4;
    local_78.write_digits.upper = SUB81((ulong)lVar4 >> 0x20,0);
    local_78.prefix = uVar15;
    aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_&>
                      ((appender)this,specs_00,local_78.data.size,local_78.data.size,&local_78);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  case bin_lower:
  case bin_upper:
    if ((char)*(ushort *)&specs_00->field_0x9 < '\0') {
      uVar10 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar14 = uVar10 << 8;
      if (uVar15 == 0) {
        uVar14 = uVar10;
      }
      uVar15 = (uVar14 | uVar15) + 0x2000000;
    }
    bVar11 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    lVar16 = 0;
    do {
      lVar4 = lVar16;
      lVar16 = lVar4 + 1;
      bVar18 = (buffer<char> *)0x1 < bVar11.container;
      bVar11.container = bVar11.container >> 1;
    } while (bVar18);
    uVar14 = specs_00->width;
    iVar2 = specs_00->precision;
    if (iVar2 == -1 && uVar14 == 0) {
      if ((uVar15 != 0) && (uVar14 = uVar15 & 0xffffff, (uVar15 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
            (*(code *)**(undefined8 **)this)(this);
          }
          lVar6 = *(long *)(this + 0x10);
          *(long *)(this + 0x10) = lVar6 + 1;
          *(char *)(*(long *)(this + 8) + lVar6) = (char)uVar14;
          bVar18 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar18);
      }
      lVar6 = *(long *)(this + 0x10);
      uVar17 = lVar6 + lVar16;
      if (*(ulong *)(this + 0x18) < uVar17) {
        lVar6 = 0;
      }
      else {
        *(ulong *)(this + 0x10) = uVar17;
        lVar6 = lVar6 + *(long *)(this + 8);
      }
      if (lVar6 != 0) {
        pbVar7 = (byte *)(lVar6 + lVar16);
        do {
          pbVar7 = pbVar7 + -1;
          *pbVar7 = SUB81(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,0
                         ) & 1 | 0x30;
          bVar18 = (buffer<char> *)0x1 <
                   (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 1
               );
        } while (bVar18);
        return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)this;
      }
      pbVar7 = (byte *)((long)&local_78.prefix + lVar4);
      pcVar9 = (char *)((long)&local_78.prefix + lVar4 + 1);
      do {
        *pbVar7 = SUB81(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,0)
                  & 1 | 0x30;
        pbVar7 = pbVar7 + -1;
        bVar18 = (buffer<char> *)0x1 <
                 (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 1);
      } while (bVar18);
      goto LAB_00125a47;
    }
    uVar10 = uVar15 >> 0x18;
    local_78.data.size = (ulong)uVar10 + lVar16;
    local_78.write_digits.num_digits = (int)lVar16;
    if ((*(ushort *)&specs_00->field_0x9 & 0xf) == 4) {
      if ((uint)local_78.data.size < uVar14) {
        local_78.data.padding = ((ulong)uVar14 - (ulong)uVar10) - lVar16;
        local_78.data.size = (ulong)uVar14;
        goto LAB_00125740;
      }
    }
    else if (local_78.write_digits.num_digits < iVar2) {
      local_78.data.size = (size_t)(uVar10 + iVar2);
      local_78.data.padding = (size_t)(uint)(iVar2 - local_78.write_digits.num_digits);
      goto LAB_00125740;
    }
    local_78.data.padding = 0;
LAB_00125740:
    local_78.prefix = uVar15;
    aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_&>
                      ((appender)this,specs_00,local_78.data.size,local_78.data.size,
                       (anon_class_40_3_03e05ccd *)&local_78);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_78.prefix =
         CONCAT31(local_78.prefix._1_3_,
                  (char)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    aVar5 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write_char<char,fmt::v8::appender>(fmt::v8::appender,char,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_&>
                      ((appender)this,specs_00,1,1,(anon_class_1_1_a8c68091 *)&local_78);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (((specs_00->field_0xa & 1) != 0) &&
     (bVar18 = write_int_localized<fmt::v8::appender,unsigned_long,char>
                         ((appender *)&local_80,
                          (unsigned_long)
                          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                          uVar15,specs_00,(locale_ref)specs), bVar18)) {
    return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_80.container;
  }
  this = (detail *)local_80.container;
  lVar16 = 0x3f;
  if (((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container | 1) != 0) {
    for (; ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container | 1) >>
           lVar16 == 0; lVar16 = lVar16 + -1) {
    }
  }
  size = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar16] -
         (uint)((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container <
               *(buffer<char> **)
                (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar16] * 8));
  uVar14 = specs_00->width;
  iVar2 = specs_00->precision;
  if (iVar2 == -1 && uVar14 == 0) {
    if ((uVar15 != 0) &&
       (uVar15 = uVar15 & 0xffffff,
       ((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
      do {
        if (((buffer<char> *)this)->capacity_ < ((buffer<char> *)this)->size_ + 1) {
          (**((buffer<char> *)this)->_vptr_buffer)(this);
        }
        sVar3 = ((buffer<char> *)this)->size_;
        ((buffer<char> *)this)->size_ = sVar3 + 1;
        ((buffer<char> *)this)->ptr_[sVar3] = (char)uVar15;
        bVar18 = 0xff < uVar15;
        uVar15 = uVar15 >> 8;
      } while (bVar18);
    }
    fVar19 = format_decimal<char,unsigned_long>
                       ((char *)&local_78,
                        (unsigned_long)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                        size);
    pcVar9 = fVar19.end;
LAB_00125a47:
    aVar5 = copy_str_noinline<char,char*,fmt::v8::appender>((char *)&local_78,pcVar9,(appender)this)
    ;
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  uVar10 = size + (uVar15 >> 0x18);
  local_78.data.size = (size_t)uVar10;
  if ((*(ushort *)&specs_00->field_0x9 & 0xf) == 4) {
    if (uVar10 < uVar14) {
      local_78.data.padding = uVar14 - local_78.data.size;
      local_78.data.size = (ulong)uVar14;
      goto LAB_00125822;
    }
  }
  else {
    local_78.data.padding = (size_t)(uint)(iVar2 - size);
    if (iVar2 - size != 0 && size <= iVar2) {
      local_78.data.size = (size_t)(iVar2 + (uVar15 >> 0x18));
      goto LAB_00125822;
    }
  }
  local_78.data.padding = 0;
LAB_00125822:
  local_78.prefix = uVar15;
  local_78.write_digits.num_digits = size;
  aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_&>
                    ((appender)local_80.container,specs_00,local_78.data.size,local_78.data.size,
                     (anon_class_40_3_03e05ccd *)&local_78);
  return (appender)
         aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}